

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

void __thiscall soul::SourceCodeOperations::SourceCodeOperations(SourceCodeOperations *this)

{
  (this->source).sourceCode.object = (SourceCodeText *)0x0;
  (this->source).location.data = (char *)0x0;
  AST::Allocator::Allocator(&this->allocator);
  memset(&this->topLevelNamespace,0,0x88);
  return;
}

Assistant:

SourceCodeOperations::SourceCodeOperations() = default;